

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LazyJSONString.cpp
# Opt level: O3

Var __thiscall Js::LazyJSONString::ReconstructVar(LazyJSONString *this,JSONProperty *prop)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptBoolean *pJVar4;
  DynamicObject *pDVar5;
  JavascriptArray *pJVar6;
  
  switch(prop->type) {
  case Array:
    pJVar6 = ReconstructArray(this,(JSONArray *)(prop->field_1).numericValue.value.ptr);
    return pJVar6;
  case Object:
    pDVar5 = ReconstructObject(this,(JSONObject *)(prop->field_1).numericValue.value.ptr);
    return pDVar5;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/LazyJSONString.cpp"
                                ,0x96,"((0))","(0)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pJVar4 = (JavascriptBoolean *)0x0;
    break;
  case Null:
    pJVar4 = (JavascriptBoolean *)
             (((((this->super_JavascriptString).super_RecyclableObject.type.ptr)->javascriptLibrary)
              .ptr)->super_JavascriptLibraryBase).nullValue.ptr;
    break;
  case True:
    pJVar4 = (((((this->super_JavascriptString).super_RecyclableObject.type.ptr)->javascriptLibrary)
              .ptr)->super_JavascriptLibraryBase).booleanTrue.ptr;
    break;
  case False:
    pJVar4 = (((((this->super_JavascriptString).super_RecyclableObject.type.ptr)->javascriptLibrary)
              .ptr)->super_JavascriptLibraryBase).booleanFalse.ptr;
    break;
  case Number:
  case String:
    pJVar4 = (JavascriptBoolean *)(prop->field_1).numericValue.value.ptr;
  }
  return pJVar4;
}

Assistant:

Var
LazyJSONString::ReconstructVar(_In_ JSONProperty* prop) const
{
    switch (prop->type)
    {
    case JSONContentType::Array:
        return ReconstructArray(prop->arr);
    case JSONContentType::Null:
        return this->GetLibrary()->GetNull();
    case JSONContentType::True:
        return this->GetLibrary()->GetTrue();
    case JSONContentType::False:
        return this->GetLibrary()->GetFalse();
    case JSONContentType::Number:
        return prop->numericValue.value;
    case JSONContentType::String:
        return prop->stringValue;
    case JSONContentType::Object:
        return ReconstructObject(prop->obj);
    default:
        Assume(UNREACHED);
        return nullptr;
    }
}